

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s_main.c
# Opt level: O2

void sys_fakefromgui(void)

{
  int iVar1;
  char *pcVar2;
  long lVar3;
  t_symbol *s;
  t_atom zz [38];
  char buf [1000];
  
  s = (t_symbol *)0x3e8;
  pcVar2 = getcwd(buf,1000);
  if (pcVar2 == (char *)0x0) {
    buf[0] = '.';
    buf[1] = '\0';
  }
  zz[0].a_type = A_SYMBOL;
  pcVar2 = buf;
  zz[0].a_w.w_symbol = gensym(pcVar2);
  zz[1].a_type = A_FLOAT;
  zz[1].a_w.w_float = 0.0;
  for (lVar3 = 0; lVar3 != 0x90; lVar3 = lVar3 + 4) {
    iVar1 = *(int *)((long)defaultfontshit + lVar3);
    (&zz[2].a_type)[lVar3] = A_FLOAT;
    *(float *)((long)&zz[2].a_w + lVar3 * 4) = (float)iVar1;
  }
  glob_initfromgui(pcVar2,s,0x26,zz);
  clock_free(sys_fakefromguiclk);
  return;
}

Assistant:

static void sys_fakefromgui(void)
{
        /* fake the GUI's message giving cwd and font sizes in case
        we aren't starting the gui. */
    t_atom zz[NDEFAULTFONT+2];
    int i;
    char buf[MAXPDSTRING];
#ifdef _WIN32
    if (GetCurrentDirectory(MAXPDSTRING, buf) == 0)
        strcpy(buf, ".");
#else
    if (!getcwd(buf, MAXPDSTRING))
        strcpy(buf, ".");
#endif
    SETSYMBOL(zz, gensym(buf));
    SETFLOAT(zz+1, 0);
    for (i = 0; i < (int)NDEFAULTFONT; i++)
        SETFLOAT(zz+i+2, defaultfontshit[i]);
    glob_initfromgui(0, 0, 2+NDEFAULTFONT, zz);
    clock_free(sys_fakefromguiclk);
}